

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# troposphere.cpp
# Opt level: O3

double Hopefield(double E,double H,double t0,double p0,double RH0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = Rad2Deg(E);
  dVar2 = exp(H * -0.0006396);
  dVar3 = pow(H * -2.26e-05 + 1.0,5.225);
  dVar6 = H * -0.0065 + t0 + 273.16;
  dVar4 = exp(dVar6 * -0.000256908 * dVar6 + dVar6 * 0.213166 + -37.2465);
  dVar5 = Deg2Rad(SQRT(dVar1 * dVar1 + 6.25));
  dVar5 = sin(dVar5);
  dVar1 = Deg2Rad(SQRT(dVar1 * dVar1 + 2.25));
  dVar1 = sin(dVar1);
  return (dVar4 * dVar2 * RH0 * (0.0746512 / (dVar6 * dVar6)) * (11000.0 - H)) / dVar1 +
         ((((t0 + 273.16 + -273.16) * 148.72 + 40136.0) - H) * ((dVar3 * p0 * 1.552e-05) / dVar6)) /
         dVar5;
}

Assistant:

double Hopefield(const double E, const double H, double t0,
                 double p0, double RH0)
{
    double E1 = Rad2Deg(E);
    double hw = 11000, H0 = 0.0;
    double T0 = t0 + 273.16;
    double RH = RH0 * exp(-0.0006396 * (H - H0));
    double p = p0 * pow(1 - 0.0000226 * (H - H0), 5.225);
    double T = T0 - 0.0065 * (H - H0);
    double e = RH * exp(-37.2465 + 0.213166 * T - 0.000256908 * T * T);
    double hd = 40136 + 148.72 * (T0 - 273.16);
    double Kd = 155.2e-7 * p / T * (hd - H);
    double Kw = 155.2e-7 * 4810.0 / (T * T) * e * (hw - H);
    double left = Kd / sin(Deg2Rad(sqrt(E1 * E1 + 6.25)));
    double right = Kw / sin(Deg2Rad(sqrt(E1 * E1 + 2.25)));
    return left + right;
}